

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O3

void __thiscall
ON_SimpleArray<ON_SubDEdgePtr>::Prepend
          (ON_SimpleArray<ON_SubDEdgePtr> *this,int count,ON_SubDEdgePtr *buffer)

{
  ON_SubDEdgePtr *pOVar1;
  size_t sz;
  ON_SubDEdgePtr *__dest;
  uint uVar2;
  ON_SubDEdgePtr *__dest_00;
  ON_SubDEdgePtr *pOVar3;
  uint uVar4;
  ON_SubDEdgePtr *pOVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  
  if (buffer != (ON_SubDEdgePtr *)0x0 && 0 < count) {
    sz = (ulong)(uint)count * 8;
    uVar4 = this->m_count;
    uVar2 = this->m_capacity;
    uVar6 = count + uVar4;
    if ((int)uVar2 < (int)uVar6) {
      if ((int)uVar4 < 8 || (ulong)((long)(int)uVar4 * 8) < 0x10000001) {
        uVar7 = 4;
        if (2 < (int)uVar4) {
          uVar7 = uVar4 * 2;
        }
      }
      else {
        uVar7 = 0x2000008;
        if (uVar4 < 0x2000008) {
          uVar7 = uVar4;
        }
        uVar7 = uVar7 + uVar4;
      }
      if ((int)uVar6 < (int)uVar7) {
        uVar6 = uVar7;
      }
      if (buffer < this->m_a + (int)uVar2 && this->m_a <= buffer) {
        __dest_00 = (ON_SubDEdgePtr *)onmalloc(sz);
        memcpy(__dest_00,buffer,sz);
        uVar2 = this->m_capacity;
        buffer = __dest_00;
      }
      else {
        __dest_00 = (ON_SubDEdgePtr *)0x0;
      }
      if (uVar2 < uVar6) {
        SetCapacity(this,(long)(int)uVar6);
      }
      uVar4 = this->m_count;
    }
    else {
      __dest_00 = (ON_SubDEdgePtr *)0x0;
    }
    lVar8 = (ulong)(uint)count + (long)(int)uVar4;
    __dest = this->m_a;
    if (0 < (int)uVar4) {
      pOVar3 = __dest + (int)uVar4;
      pOVar5 = __dest + lVar8;
      do {
        pOVar5 = pOVar5 + -1;
        pOVar1 = pOVar3 + -1;
        pOVar3 = pOVar3 + -1;
        pOVar5->m_ptr = pOVar1->m_ptr;
      } while (__dest < pOVar3);
    }
    memcpy(__dest,buffer,sz);
    if (__dest_00 != (ON_SubDEdgePtr *)0x0) {
      onfree(__dest_00);
    }
    this->m_count = (int)lVar8;
  }
  return;
}

Assistant:

void ON_SimpleArray<T>::Prepend( int count, const T* buffer ) 
{
  if ( count > 0 && nullptr != buffer ) 
  {
    const size_t sizeof_buffer = count * sizeof(T);
    void* temp = nullptr;
    if ( count + m_count > m_capacity ) 
    {
      int newcapacity = NewCapacity();
      if ( newcapacity < count + m_count )
        newcapacity = count + m_count;
      if ( buffer >= m_a && buffer < (m_a + m_capacity) )
      {
        // buffer is in the block of memory about to be reallocated
        temp = onmalloc(sizeof_buffer);
        memcpy(temp, buffer, sizeof_buffer);
        buffer = (const T*)temp;
      }
      Reserve( newcapacity );
    }

    const size_t count0 = (size_t)m_count;
    const size_t count1 = count0 + ((size_t)count);
    T* p0 = m_a;
    T* p = p0 + count0;
    T* p1 = m_a + count1;
    while (p > p0)
      *(--p1) = *(--p);
    memcpy( (void*)(m_a), (void*)(buffer), sizeof_buffer );
    if (nullptr != temp)
      onfree(temp);
    m_count = (int)count1;
  }
}